

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::AddKel
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this,
          TPZFMatrix<double> *elmat,TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  DecomposeType DVar1;
  TPZFrontSym<double> *this_00;
  TPZBaseMatrix *in_RDI;
  TPZEqnArray<double> AuxEqn;
  int64_t maxeq;
  int64_t mineq;
  undefined4 in_stack_ffffffffffffcd10;
  TPZEqnArray<double> *in_stack_ffffffffffffcd18;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>
  *in_stack_ffffffffffffcd20;
  TPZFrontSym<double> *in_stack_ffffffffffffcd30;
  TPZVec<long> *in_stack_ffffffffffffcd38;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>
  *in_stack_ffffffffffffcd40;
  TPZVec<long> *in_stack_ffffffffffffcd48;
  TPZVec<long> *in_stack_ffffffffffffcd50;
  TPZFMatrix<double> *in_stack_ffffffffffffcd58;
  TPZFrontSym<double> *in_stack_ffffffffffffcd60;
  TPZEqnArray<double> *in_stack_ffffffffffffffb8;
  TPZStackEqnStorage<double> *in_stack_ffffffffffffffc0;
  undefined1 *local_30;
  long local_28;
  
  TPZFrontSym<double>::AddKel
            (in_stack_ffffffffffffcd60,in_stack_ffffffffffffcd58,in_stack_ffffffffffffcd50,
             in_stack_ffffffffffffcd48);
  EquationsToDecompose
            (in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38,
             (int64_t *)in_stack_ffffffffffffcd30,(int64_t *)in_RDI);
  TPZEqnArray<double>::TPZEqnArray((TPZEqnArray<double> *)in_stack_ffffffffffffcd40);
  if (local_28 <= (long)local_30) {
    TPZFrontSym<double>::DecomposeEquations
              (in_stack_ffffffffffffcd30,(int64_t)in_RDI,(int64_t)in_stack_ffffffffffffcd20,
               in_stack_ffffffffffffcd18);
    CheckCompress(in_stack_ffffffffffffcd20);
    TPZStackEqnStorage<double>::AddEqnArray(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    this_00 = (TPZFrontSym<double> *)TPZBaseMatrix::Rows(in_RDI);
    if (local_30 == (undefined1 *)((long)&this_00[-1].super_TPZFront<double>.fProductMTData + 7)) {
      TPZFrontSym<double>::Reset(this_00,(int64_t)local_30);
      TPZStackEqnStorage<double>::FinishWriting((TPZStackEqnStorage<double> *)(in_RDI + 1));
      TPZStackEqnStorage<double>::ReOpen((TPZStackEqnStorage<double> *)(in_RDI + 1));
    }
  }
  DVar1 = TPZFrontSym<double>::GetDecomposeType((TPZFrontSym<double> *)&in_RDI[0xfcf].fRow);
  in_RDI->fDecomposed = (char)DVar1;
  TPZEqnArray<double>::~TPZEqnArray
            ((TPZEqnArray<double> *)CONCAT44(DVar1,in_stack_ffffffffffffcd10));
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & sourceindex, TPZVec < int64_t > & destinationindex)
{
	fFront.AddKel(elmat, sourceindex, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isInfoEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< fFront.FrontSize();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif
	
	int64_t mineq, maxeq;
	EquationsToDecompose(destinationindex, mineq, maxeq);
	TPZEqnArray<TVar> AuxEqn;
	if(maxeq >= mineq) {
		fFront.DecomposeEquations(mineq,maxeq,AuxEqn);
		CheckCompress();
		fStorage.AddEqnArray(&AuxEqn);
		if(maxeq == this->Rows()-1){
			fFront.Reset(0);
			fStorage.FinishWriting();
			fStorage.ReOpen();
		}
	}
	this->fDecomposed = fFront.GetDecomposeType();
}